

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VCVT_fix_dp(DisasContext_conflict1 *s,arg_VCVT_fix_dp *a)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict1 *s_00;
  _Bool _Var3;
  TCGTemp *a1;
  TCGTemp *pTVar4;
  TCGv_i32 pTVar5;
  _Bool _Var6;
  uintptr_t o_1;
  code *func;
  uintptr_t o;
  uintptr_t o_2;
  TCGv_i64 ret;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_i64 local_48;
  TCGTemp *local_38;
  
  uVar1 = s->isar->mvfr0;
  if (((uVar1 & 0xe00) == 0) ||
     ((s_00 = s->uc->tcg_ctx, (uVar1 & 0xe) == 0 && ((a->vd & 0x10) != 0)))) {
    _Var6 = false;
  }
  else {
    _Var3 = full_vfp_access_check(s,false);
    _Var6 = true;
    if (_Var3) {
      uVar1 = a->opc;
      iVar2 = a->imm;
      a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)((uint)a->vd >> 1) * 0x100 + (ulong)(a->vd & 1) * 8 + 0xc10);
      pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      ret = (TCGv_i64)((long)pTVar4 - (long)s_00);
      tcg_gen_addi_i64_aarch64(s_00,ret,(TCGv_i64)s_00->cpu_env,0x2ec8);
      pTVar5 = tcg_const_i32_aarch64(s_00,((uVar1 & 1) * 0x10 - iVar2) + 0x10);
      if (7 < (uint)a->opc) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-vfp.inc.c"
                   ,0xaf5,(char *)0x0);
      }
      switch(a->opc) {
      case 0:
        func = helper_vfp_shtod_aarch64;
        break;
      case 1:
        func = helper_vfp_sltod_aarch64;
        break;
      case 2:
        func = helper_vfp_uhtod_aarch64;
        break;
      case 3:
        func = helper_vfp_ultod_aarch64;
        break;
      case 4:
        func = helper_vfp_toshd_round_to_zero_aarch64;
        break;
      case 5:
        func = helper_vfp_tosld_round_to_zero_aarch64;
        break;
      case 6:
        func = helper_vfp_touhd_round_to_zero_aarch64;
        break;
      case 7:
        func = helper_vfp_tould_round_to_zero_aarch64;
      }
      local_48 = (TCGv_i64)((long)s_00 + (long)ret);
      local_50 = pTVar5 + (long)&s_00->pool_cur;
      local_58 = (TCGTemp *)((long)s_00 + ((long)a1 - (long)s_00));
      local_38 = a1;
      tcg_gen_callN_aarch64(s_00,func,local_58,3,&local_58);
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)local_38,(TCGArg)(s_00->cpu_env + (long)s_00)
                          ,(ulong)((uint)a->vd >> 1) * 0x100 + (ulong)(a->vd & 1) * 8 + 0xc10);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(((long)a1 - (long)s_00) + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar5 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
    }
  }
  return _Var6;
}

Assistant:

static bool trans_VCVT_fix_dp(DisasContext *s, arg_VCVT_fix_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 vd;
    TCGv_i32 shift;
    TCGv_ptr fpst;
    int frac_bits;

    if (!dc_isar_feature(aa32_fpdp_v3, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vd & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    frac_bits = (a->opc & 1) ? (32 - a->imm) : (16 - a->imm);

    vd = tcg_temp_new_i64(tcg_ctx);
    neon_load_reg64(tcg_ctx, vd, a->vd);

    fpst = get_fpstatus_ptr(tcg_ctx, false);
    shift = tcg_const_i32(tcg_ctx, frac_bits);

    /* Switch on op:U:sx bits */
    switch (a->opc) {
    case 0:
        gen_helper_vfp_shtod(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 1:
        gen_helper_vfp_sltod(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 2:
        gen_helper_vfp_uhtod(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 3:
        gen_helper_vfp_ultod(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 4:
        gen_helper_vfp_toshd_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 5:
        gen_helper_vfp_tosld_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 6:
        gen_helper_vfp_touhd_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 7:
        gen_helper_vfp_tould_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    default:
        g_assert_not_reached();
    }

    neon_store_reg64(tcg_ctx, vd, a->vd);
    tcg_temp_free_i64(tcg_ctx, vd);
    tcg_temp_free_i32(tcg_ctx, shift);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    return true;
}